

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O1

QVariant * __thiscall
QLineEdit::inputMethodQuery
          (QVariant *__return_storage_ptr__,QLineEdit *this,InputMethodQuery property,
          QVariant argument)

{
  int iVar1;
  int iVar2;
  QLineEditPrivate *this_00;
  QWidgetLineControl *pQVar3;
  int iVar4;
  int iVar5;
  QLineEditPrivate *d;
  long in_FS_OFFSET;
  bool bVar6;
  double dVar7;
  double in_XMM1_Qa;
  QRect QVar8;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  if ((int)property < 0x80) {
    if ((int)property < 0x10) {
      switch(property) {
      case ImEnabled:
        if ((((this->super_QWidget).data)->widget_attributes & 1) == 0) {
          bVar6 = (this_00->control->field_0x50 & 4) == 0;
        }
        else {
          bVar6 = false;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
LAB_004220ee:
          ::QVariant::QVariant(__return_storage_ptr__,bVar6);
          return __return_storage_ptr__;
        }
        break;
      case ImCursorRectangle:
        QVar8 = QLineEditPrivate::cursorRect(this_00);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          ::QVariant::QVariant(__return_storage_ptr__,QVar8);
          return __return_storage_ptr__;
        }
        break;
      default:
switchD_00421dde_caseD_3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QWidget::inputMethodQuery(__return_storage_ptr__,&this->super_QWidget,property);
          return __return_storage_ptr__;
        }
        break;
      case ImFont:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QFont::operator_cast_to_QVariant
                    (__return_storage_ptr__,&((this->super_QWidget).data)->fnt);
          return __return_storage_ptr__;
        }
        break;
      case ImCursorPosition:
switchD_00421dde_caseD_8:
        dVar7 = (double)::QVariant::toPointF();
        if (((dVar7 == 0.0) && (!NAN(dVar7))) && ((in_XMM1_Qa == 0.0 && (!NAN(in_XMM1_Qa))))) {
          iVar5 = this_00->control->m_cursor;
LAB_00421f19:
          if (*(long *)(in_FS_OFFSET + 0x28) != local_20) break;
          goto LAB_0042203b;
        }
        iVar4 = QLineEditPrivate::xToPos(this_00,(int)dVar7,CursorBetweenCharacters);
LAB_00421f98:
        iVar5 = iVar4;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
LAB_0042203b:
          ::QVariant::QVariant(__return_storage_ptr__,iVar5);
          return __return_storage_ptr__;
        }
      }
      goto LAB_00422191;
    }
    if (property == ImSurroundingText) {
      QWidgetLineControl::surroundingText(&local_38,(QWidgetLineControl *)this_00->control);
    }
    else {
      if (property != ImCurrentSelection) {
        if (property == ImMaximumTextLength) {
          iVar5 = this_00->control->m_maxLength;
          goto LAB_00421f19;
        }
        goto switchD_00421dde_caseD_3;
      }
      selectedText(&local_38,this);
    }
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_38);
LAB_00422157:
    if (local_38.d.d != (Data *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    if ((int)property < 0x1000) {
      if (property == ImAnchorPosition) {
        pQVar3 = this_00->control;
        bVar6 = (pQVar3->m_text).d.size == 0;
        iVar1 = pQVar3->m_selend;
        iVar2 = pQVar3->m_selstart;
        iVar5 = iVar2;
        if (bVar6 || iVar1 <= iVar2) {
          iVar5 = -1;
        }
        iVar4 = -1;
        if (!bVar6 && iVar2 < iVar1) {
          iVar4 = iVar1;
        }
        if (iVar5 == iVar4) {
          iVar5 = pQVar3->m_cursor;
          if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_00422191;
          goto LAB_0042203b;
        }
        if (iVar5 != pQVar3->m_cursor) goto LAB_00421f19;
        goto LAB_00421f98;
      }
      if (property == ImAbsolutePosition) goto switchD_00421dde_caseD_8;
      if (property != ImTextBeforeCursor) goto switchD_00421dde_caseD_3;
      dVar7 = (double)::QVariant::toPointF();
      if ((((dVar7 != 0.0) || (NAN(dVar7))) || (in_XMM1_Qa != 0.0)) || (NAN(in_XMM1_Qa))) {
        iVar5 = QLineEditPrivate::xToPos(this_00,(int)dVar7,CursorBetweenCharacters);
      }
      else {
        iVar5 = this_00->control->m_cursor;
      }
      QLineEditPrivate::textBeforeCursor(&local_38,this_00,iVar5);
LAB_00422149:
      ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_38);
      goto LAB_00422157;
    }
    if (property == ImTextAfterCursor) {
      dVar7 = (double)::QVariant::toPointF();
      if (((dVar7 != 0.0) || (NAN(dVar7))) || ((in_XMM1_Qa != 0.0 || (NAN(in_XMM1_Qa))))) {
        iVar5 = QLineEditPrivate::xToPos(this_00,(int)dVar7,CursorBetweenCharacters);
      }
      else {
        iVar5 = this_00->control->m_cursor;
      }
      QLineEditPrivate::textAfterCursor(&local_38,this_00,iVar5);
      goto LAB_00422149;
    }
    if (property != ImAnchorRectangle) {
      if (property == ImReadOnly) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          bVar6 = SUB41((*(ushort *)&this_00->control->field_0x50 & 4) >> 2,0);
          goto LAB_004220ee;
        }
        goto LAB_00422191;
      }
      goto switchD_00421dde_caseD_3;
    }
    local_38.d._0_16_ = QWidgetLineControl::anchorRect((QWidgetLineControl *)this_00->control);
    QVar8 = QLineEditPrivate::adjustedControlRect(this_00,(QRect *)&local_38);
    ::QVariant::QVariant(__return_storage_ptr__,QVar8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
LAB_00422191:
  __stack_chk_fail();
}

Assistant:

QVariant QLineEdit::inputMethodQuery(Qt::InputMethodQuery property, QVariant argument) const
{
    Q_D(const QLineEdit);
    switch(property) {
    case Qt::ImEnabled:
        return isEnabled() && !isReadOnly();
    case Qt::ImCursorRectangle:
        return d->cursorRect();
    case Qt::ImAnchorRectangle:
        return d->adjustedControlRect(d->control->anchorRect());
    case Qt::ImFont:
        return font();
    case Qt::ImAbsolutePosition:
    case Qt::ImCursorPosition: {
        const QPointF pt = argument.toPointF();
        if (!pt.isNull())
            return QVariant(d->xToPos(pt.x(), QTextLine::CursorBetweenCharacters));
        return QVariant(d->control->cursor()); }
    case Qt::ImSurroundingText:
        return QVariant(d->control->surroundingText());
    case Qt::ImCurrentSelection:
        return QVariant(selectedText());
    case Qt::ImMaximumTextLength:
        return QVariant(maxLength());
    case Qt::ImAnchorPosition:
        if (d->control->selectionStart() == d->control->selectionEnd())
            return QVariant(d->control->cursor());
        else if (d->control->selectionStart() == d->control->cursor())
            return QVariant(d->control->selectionEnd());
        else
            return QVariant(d->control->selectionStart());
    case Qt::ImReadOnly:
        return isReadOnly();
    case Qt::ImTextBeforeCursor: {
        const QPointF pt = argument.toPointF();
        if (!pt.isNull())
            return d->textBeforeCursor(d->xToPos(pt.x(), QTextLine::CursorBetweenCharacters));
        else
            return d->textBeforeCursor(d->control->cursor()); }
    case Qt::ImTextAfterCursor: {
        const QPointF pt = argument.toPointF();
        if (!pt.isNull())
            return d->textAfterCursor(d->xToPos(pt.x(), QTextLine::CursorBetweenCharacters));
        else
            return d->textAfterCursor(d->control->cursor()); }
    default:
        return QWidget::inputMethodQuery(property);
    }
}